

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImTriangulator::BuildReflexes(ImTriangulator *this)

{
  float fVar1;
  float fVar2;
  ImTriangulatorNode *pIVar3;
  int iVar4;
  ImTriangulatorNode **ppIVar5;
  int iVar6;
  long lVar7;
  
  if (-1 < this->_TrianglesLeft) {
    ppIVar5 = &this->_Nodes;
    iVar6 = (this->_Reflexes).Size;
    iVar4 = this->_TrianglesLeft + 1;
    do {
      pIVar3 = *ppIVar5;
      fVar1 = (pIVar3->Pos).x;
      fVar2 = (pIVar3->Pos).y;
      if (((pIVar3->Next->Pos).y - fVar2) * (fVar1 - (pIVar3->Prev->Pos).x) -
          (fVar2 - (pIVar3->Prev->Pos).y) * ((pIVar3->Next->Pos).x - fVar1) <= 0.0) {
        pIVar3->Type = ImTriangulatorNodeType_Reflex;
        lVar7 = (long)iVar6;
        iVar6 = iVar6 + 1;
        (this->_Reflexes).Size = iVar6;
        (this->_Reflexes).Data[lVar7] = pIVar3;
      }
      ppIVar5 = &pIVar3->Next;
      iVar4 = iVar4 + -1;
    } while (0 < iVar4);
  }
  return;
}

Assistant:

void ImTriangulator::BuildReflexes()
{
    ImTriangulatorNode* n1 = _Nodes;
    for (int i = _TrianglesLeft; i >= 0; i--, n1 = n1->Next)
    {
        if (ImTriangleIsClockwise(n1->Prev->Pos, n1->Pos, n1->Next->Pos))
            continue;
        n1->Type = ImTriangulatorNodeType_Reflex;
        _Reflexes.push_back(n1);
    }
}